

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O0

void __thiscall ThreadRegionsBuilder::visit(ThreadRegionsBuilder *this,Node *node)

{
  bool bVar1;
  ThreadRegionsBuilder *in_RSI;
  NodeIterator *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<Node_*const,_ThreadRegion_*>,_false,_false>,_bool>
  pVar2;
  ThreadRegion *successorRegion;
  Node *successor;
  NodeIterator __end1;
  NodeIterator __begin1;
  Node *__range1;
  Node *in_stack_ffffffffffffff28;
  ThreadRegion *in_stack_ffffffffffffff30;
  iterator *this_00;
  ThreadRegionsBuilder *in_stack_ffffffffffffff38;
  ThreadRegion *in_stack_ffffffffffffff40;
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
  *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<Node_*const,_ThreadRegion_*>,_false> in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff71;
  ThreadRegionsBuilder *this_01;
  
  this_01 = in_RSI;
  Node::begin((Node *)in_stack_ffffffffffffff30);
  Node::end((Node *)in_stack_ffffffffffffff30);
  while (bVar1 = NodeIterator::operator!=
                           ((NodeIterator *)in_stack_ffffffffffffff30,
                            (NodeIterator *)in_stack_ffffffffffffff28), bVar1) {
    NodeIterator::operator*(in_RDI);
    bVar1 = visited((ThreadRegionsBuilder *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) {
      region((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,(Node *)in_stack_ffffffffffffff38);
      bVar1 = examined(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if (bVar1) {
        in_stack_ffffffffffffff40 =
             region((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,
                    (Node *)in_stack_ffffffffffffff38);
        region((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,(Node *)in_stack_ffffffffffffff38);
        ThreadRegion::addSuccessor
                  ((ThreadRegion *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                   (ThreadRegion *)in_stack_ffffffffffffff68._M_cur);
      }
      else {
        bVar1 = shouldCreateNewRegion
                          ((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,
                           (Node *)in_stack_ffffffffffffff38,(Node *)in_stack_ffffffffffffff30);
        if (bVar1) {
          in_stack_ffffffffffffff38 = (ThreadRegionsBuilder *)operator_new(0xa0);
          ThreadRegion::ThreadRegion(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::
          insert(in_stack_ffffffffffffff50,(value_type *)in_RDI);
          region((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,(Node *)in_stack_ffffffffffffff38
                );
          ThreadRegion::addSuccessor
                    ((ThreadRegion *)CONCAT71(in_stack_ffffffffffffff71,in_stack_ffffffffffffff70),
                     (ThreadRegion *)in_stack_ffffffffffffff68._M_cur);
        }
        else {
          region((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,(Node *)in_stack_ffffffffffffff38
                );
        }
        pVar2 = std::
                unordered_map<Node*,ThreadRegion*,std::hash<Node*>,std::equal_to<Node*>,std::allocator<std::pair<Node*const,ThreadRegion*>>>
                ::emplace<Node*&,ThreadRegion*&>
                          ((unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
                            *)in_stack_ffffffffffffff40,(Node **)in_stack_ffffffffffffff38,
                           (ThreadRegion **)in_stack_ffffffffffffff30);
        in_stack_ffffffffffffff68._M_cur =
             (__node_type *)
             pVar2.first.super__Node_iterator_base<std::pair<Node_*const,_ThreadRegion_*>,_false>.
             _M_cur;
        in_stack_ffffffffffffff70 = pVar2.second;
        visit(this_01,(Node *)in_RSI);
      }
    }
    NodeIterator::operator++(in_RDI);
  }
  this_00 = &in_RDI[1].successorsIterator;
  region((ThreadRegionsBuilder *)in_stack_ffffffffffffff40,(Node *)in_stack_ffffffffffffff38);
  std::
  unordered_map<Node*,ThreadRegion*,std::hash<Node*>,std::equal_to<Node*>,std::allocator<std::pair<Node*const,ThreadRegion*>>>
  ::emplace<Node*&,ThreadRegion*>
            ((unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
              *)in_stack_ffffffffffffff40,(Node **)in_stack_ffffffffffffff38,
             (ThreadRegion **)this_00);
  std::
  unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
  ::erase((unordered_map<Node_*,_ThreadRegion_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>_>
           *)this_00,(key_type *)in_stack_ffffffffffffff28);
  return;
}

Assistant:

void ThreadRegionsBuilder::visit(Node *node) {
    for (auto *successor : *node) {
        if (visited(successor)) {
            continue;
        }
        if (examined(region(successor))) {
            region(node)->addSuccessor(region(successor));
        } else {
            ThreadRegion *successorRegion = nullptr;
            if (shouldCreateNewRegion(node, successor)) {
                successorRegion = new ThreadRegion(successor);
                threadRegions_.insert(successorRegion);
                region(node)->addSuccessor(successorRegion);
            } else {
                successorRegion = region(node);
            }
            this->visitedNodeToRegionMap.emplace(successor, successorRegion);
            visit(successor);
        }
    }
    this->examinedNodeToRegionMap.emplace(node, region(node));
    this->visitedNodeToRegionMap.erase(node);
}